

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O2

int set_image_col_types(ParseData *lParse,fitsfile *fptr,char *name,int bitpix,DataInfo *varInfo,
                       iteratorCol *colIter)

{
  int iVar1;
  double dVar2;
  double tzero;
  int istatus;
  double tscale;
  
  if ((bitpix == -0x40) || (bitpix == -0x20)) {
LAB_0011de5d:
    varInfo->type = 0x104;
    colIter->datatype = 0x52;
    return 0;
  }
  if ((bitpix != 8) && (bitpix != 0x10)) {
    if (bitpix == 0x40) goto LAB_0011de5d;
    if (bitpix != 0x20) {
      snprintf((char *)&tscale,0x50,"set_image_col_types: unrecognized image bitpix [%d]\n");
      ffpmsg((char *)&tscale);
      lParse->status = 0x1b0;
      return 0x1b0;
    }
  }
  istatus = 0;
  iVar1 = ffgky(fptr,0x52,"BZERO",&tzero,(char *)0x0,&istatus);
  if (iVar1 != 0) {
    tzero = 0.0;
  }
  istatus = 0;
  iVar1 = ffgky(fptr,0x52,"BSCALE",&tscale,(char *)0x0,&istatus);
  if (iVar1 == 0) {
    dVar2 = tscale;
    if ((tscale != 1.0) || (NAN(tscale))) goto LAB_0011dea6;
  }
  else {
    tscale = 1.0;
  }
  if (((tzero == 0.0) && (!NAN(tzero))) || ((tzero == 32768.0 && (!NAN(tzero))))) {
    varInfo->type = 0x103;
    colIter->datatype = 0x29;
    return 0;
  }
  dVar2 = 1.0;
LAB_0011dea6:
  varInfo->type = 0x104;
  colIter->datatype = 0x52;
  if (DEBUG_PIXFILTER != 0) {
    printf("use DOUBLE for %s with BSCALE=%g/BZERO=%g\n",dVar2,tzero,name);
  }
  return 0;
}

Assistant:

static int set_image_col_types (ParseData *lParse,
				fitsfile * fptr, const char * name, int bitpix,
				DataInfo * varInfo, iteratorCol *colIter) {

   int istatus;
   double tscale, tzero;
   char temp[80];

   switch (bitpix) {
      case BYTE_IMG:
      case SHORT_IMG:
      case LONG_IMG:
         istatus = 0;
         if (fits_read_key(fptr, TDOUBLE, "BZERO", &tzero, NULL, &istatus))
            tzero = 0.0;

         istatus = 0;
         if (fits_read_key(fptr, TDOUBLE, "BSCALE", &tscale, NULL, &istatus))
            tscale = 1.0;

         if (tscale == 1.0 && (tzero == 0.0 || tzero == 32768.0 )) {
            varInfo->type     = LONG;
            colIter->datatype = TLONG;
         }
         else {
            varInfo->type     = DOUBLE;
            colIter->datatype = TDOUBLE;
            if (DEBUG_PIXFILTER)
                printf("use DOUBLE for %s with BSCALE=%g/BZERO=%g\n",
                        name, tscale, tzero);
         }
         break;

      case LONGLONG_IMG:
      case FLOAT_IMG:
      case DOUBLE_IMG:
         varInfo->type     = DOUBLE;
         colIter->datatype = TDOUBLE;
         break;
      default:
         snprintf(temp, 80,"set_image_col_types: unrecognized image bitpix [%d]\n",
                bitpix);
         ffpmsg(temp);
         return lParse->status = PARSE_BAD_TYPE;
   }
   return 0;
}